

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O1

int read_header(FILE *fp,char ***field_names)

{
  char cVar1;
  uint uVar2;
  char **ppcVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  size_t i;
  char **ppcVar7;
  ulong uVar8;
  char h_field [10000];
  char header [10000];
  char local_4e58 [10000];
  char local_2748 [10008];
  
  if (fp != (FILE *)0x0) {
    ppcVar3 = (char **)malloc(8);
    *field_names = ppcVar3;
    if (ppcVar3 == (char **)0x0) goto LAB_00104cf5;
    memset(local_4e58,0,10000);
    pcVar4 = fgets(local_2748,10000,(FILE *)fp);
    if (pcVar4 == (char *)0x0) {
      ppcVar3 = *field_names;
    }
    else {
      lVar5 = 0;
      uVar6 = 0;
      while( true ) {
        uVar2 = 0;
        while( true ) {
          do {
            cVar1 = local_2748[lVar5];
            lVar5 = lVar5 + 1;
          } while (cVar1 == '\r');
          if (cVar1 == '\0') goto LAB_00104cfb;
          if ((cVar1 == ',') || (cVar1 == '\n')) break;
          uVar8 = (ulong)uVar2;
          uVar2 = uVar2 + 1;
          local_4e58[uVar8] = cVar1;
        }
        ppcVar3 = (char **)realloc(*field_names,(uVar6 + 1 & 0xffffffff) << 3);
        if (ppcVar3 == (char **)0x0) {
          ppcVar3 = *field_names;
          if (ppcVar3 == (char **)0x0) goto LAB_00104cee;
          ppcVar7 = ppcVar3;
          if ((int)uVar6 != 0) {
            do {
              free(*ppcVar7);
              uVar6 = uVar6 - 1;
              ppcVar7 = ppcVar7 + 1;
            } while (uVar6 != 0);
          }
          goto LAB_00104ce6;
        }
        *field_names = ppcVar3;
        pcVar4 = strdup(local_4e58);
        ppcVar3[uVar6 & 0xffffffff] = pcVar4;
        if (pcVar4 == (char *)0x0) break;
        memset(local_4e58,0,10000);
        uVar6 = uVar6 + 1;
      }
      if ((int)uVar6 != 0) {
        uVar8 = 0;
        do {
          free(ppcVar3[uVar8]);
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
    }
LAB_00104ce6:
    free(ppcVar3);
  }
LAB_00104cee:
  *field_names = (char **)0x0;
LAB_00104cf5:
  uVar6 = 0xffffffff;
LAB_00104cfb:
  return (int)uVar6;
}

Assistant:

int read_header(FILE *fp, char ***field_names) {
    char **tmp_field_names;
    char header[LINE_MAX_LEN];
    char h_field[LINE_MAX_LEN];
    int h_field_index = 0;
    int h_field_len = 0;

    if (fp == NULL) {
        *field_names = NULL;
        return -1;
    }

    *field_names = malloc(sizeof(char *));
    if (*field_names == NULL) {
        return -1;
    }
    memset(h_field, 0, LINE_MAX_LEN);

    if (fgets(header, LINE_MAX_LEN, fp) == NULL) {
        free(*field_names);
        *field_names = NULL;
        return -1;
    }

    char chr;
    int chr_pos = 0;

    while ((chr = header[++chr_pos - 1])) {
        if (chr == ',' || chr == '\n') {
            tmp_field_names = realloc(*field_names, (h_field_index + 1) * sizeof(char *));
            if (tmp_field_names == NULL) {
                free_cstr_arr(*field_names, h_field_index);
                *field_names = NULL;
                return -1;
            }
            *field_names = tmp_field_names;
            (*field_names)[h_field_index] = strdup(h_field);

            if ((*field_names)[h_field_index] == NULL) {
                free_cstr_arr(*field_names, h_field_index);
                *field_names = NULL;
                return -1;
            }

            memset(h_field, 0, LINE_MAX_LEN);
            h_field_len = 0;
            h_field_index++;
        } else if (chr != '\n' && chr != '\r') {
            h_field[++h_field_len - 1] = chr;
        }
    }

    return h_field_index;
}